

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O2

float ncnn::compute_coord(float sx,int w,int padding_mode,int align_corner)

{
  float fVar1;
  
  if (padding_mode == 3) {
    if (align_corner != 0) {
      return (float)(w + -1) - ABS(ABS(sx) - (float)(w + -1));
    }
    fVar1 = ((float)w - ABS(ABS(sx + 0.5) - (float)w)) + -0.5;
    sx = 0.0;
  }
  else {
    if (padding_mode != 2) {
      return sx;
    }
    fVar1 = 0.0;
  }
  if (sx <= fVar1) {
    sx = fVar1;
  }
  if ((float)(w + -1) <= sx) {
    sx = (float)(w + -1);
  }
  return sx;
}

Assistant:

static float compute_coord(float sx, int w, int padding_mode, int align_corner)
{
    if (padding_mode == 2) // border
    {
        sx = border_coord(sx, w - 1);
    }
    else if (padding_mode == 3) // reflection
    {
        if (align_corner)
        {
            sx = reflect_coord(sx, w - 1);
        }
        else
        {
            sx = reflect_coord(sx + 0.5, w) - 0.5;
            sx = border_coord(sx, w - 1);
        }
    }

    return sx;
}